

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<int>::MergeFrom(RepeatedField<int> *this,RepeatedField<int> *other)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  Nullable<const_char_*> failure_msg;
  int *piVar4;
  int *__src;
  bool is_soo;
  RepeatedField<int> *local_48 [2];
  RepeatedField<int> *local_38;
  
  local_48[0] = other;
  local_38 = this;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::RepeatedField<int>const*,google::protobuf::RepeatedField<int>*>
                          (local_48,&local_38,"&other != this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = (other->soo_rep_).field_0.long_rep.elements_int;
    iVar2 = internal::SooRep::size(&other->soo_rep_,(uVar1 & 4) == 0);
    if (iVar2 != 0) {
      iVar3 = size(this);
      Reserve(this,iVar3 + iVar2);
      is_soo = (undefined1  [16])
               ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
               (undefined1  [16])0x0;
      piVar4 = elements(this,is_soo);
      iVar3 = ExchangeCurrentSize(this,is_soo,iVar3 + iVar2);
      __src = elements(other,(uVar1 & 4) == 0);
      memcpy(piVar4 + iVar3,__src,(long)iVar2 << 2);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x3ec,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_48);
}

Assistant:

inline void RepeatedField<Element>::MergeFrom(const RepeatedField& other) {
  ABSL_DCHECK_NE(&other, this);
  const bool other_is_soo = other.is_soo();
  if (auto other_size = other.size(other_is_soo)) {
    const int old_size = size();
    Reserve(old_size + other_size);
    const bool is_soo = this->is_soo();
    Element* dst =
        elements(is_soo) + ExchangeCurrentSize(is_soo, old_size + other_size);
    UninitializedCopyN(other.elements(other_is_soo), other_size, dst);
  }
}